

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O0

void __thiscall
GF2::MI<136UL,_GF2::MOGrevlex<136UL>_>::Replace
          (MI<136UL,_GF2::MOGrevlex<136UL>_> *this,size_t pos,size_t posNew)

{
  bool bVar1;
  iterator posNew_00;
  MP<136UL,_GF2::MOGrevlex<136UL>_> *in_RDX;
  MP<136UL,_GF2::MOGrevlex<136UL>_> *in_RSI;
  iterator iter;
  MI<136UL,_GF2::MOGrevlex<136UL>_> *in_stack_00000040;
  list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
  *in_stack_ffffffffffffffc8;
  _Self local_28;
  
  if (in_RSI != in_RDX) {
    posNew_00 = std::__cxx11::
                list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                ::begin(in_stack_ffffffffffffffc8);
    while( true ) {
      local_28._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
           ::end(in_stack_ffffffffffffffc8);
      bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe0,&local_28);
      if (!bVar1) break;
      std::_List_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>::operator->
                ((_List_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_> *)0x182e68);
      MP<136UL,_GF2::MOGrevlex<136UL>_>::Replace(in_RSI,(size_t)in_RDX,(size_t)posNew_00._M_node);
      std::_List_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>::operator++
                ((_List_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_> *)&stack0xffffffffffffffe0
                );
    }
    Normalize(in_stack_00000040);
  }
  return;
}

Assistant:

void Replace(size_t pos, size_t posNew)
	{	
		if (pos == posNew) return;
		for (iterator iter = begin(); iter != end(); ++iter)
			iter->Replace(pos, posNew);
		Normalize();
	}